

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tabs.cxx
# Opt level: O2

int __thiscall Fl_Tabs::tab_height(Fl_Tabs *this)

{
  int iVar1;
  Fl_Widget **ppFVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  int iVar7;
  
  iVar4 = (this->super_Fl_Group).super_Fl_Widget.h_;
  iVar5 = iVar4;
  if ((this->super_Fl_Group).children_ != 0) {
    iVar5 = (this->super_Fl_Group).super_Fl_Widget.y_;
    ppFVar2 = Fl_Group::array(&this->super_Fl_Group);
    iVar3 = (this->super_Fl_Group).super_Fl_Widget.y_;
    for (lVar6 = 0; (this->super_Fl_Group).children_ != (int)lVar6; lVar6 = lVar6 + 1) {
      iVar7 = ppFVar2[lVar6]->y_;
      iVar1 = iVar7 - iVar3;
      if (iVar3 + iVar4 <= iVar7) {
        iVar1 = iVar4;
      }
      iVar4 = iVar1;
      iVar7 = iVar7 + ppFVar2[lVar6]->h_;
      if (iVar5 < iVar7) {
        iVar5 = iVar7;
      }
    }
    iVar3 = (iVar3 - iVar5) + (this->super_Fl_Group).super_Fl_Widget.h_;
    if (iVar4 < iVar3) {
      iVar5 = 0;
      if (0 < iVar3) {
        iVar5 = -iVar3;
      }
    }
    else {
      iVar5 = 0;
      if (0 < iVar4) {
        iVar5 = iVar4;
      }
    }
  }
  return iVar5;
}

Assistant:

int Fl_Tabs::tab_height() {
  if (children() == 0) return h();
  int H = h();
  int H2 = y();
  Fl_Widget*const* a = array();
  for (int i=children(); i--;) {
    Fl_Widget* o = *a++;
    if (o->y() < y()+H) H = o->y()-y();
    if (o->y()+o->h() > H2) H2 = o->y()+o->h();
  }
  H2 = y()+h()-H2;
  if (H2 > H) return (H2 <= 0) ? 0 : -H2;
  else return (H <= 0) ? 0 : H;
}